

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::SscReader::DoClose(SscReader *this,int transportIndex)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  element_type *peVar4;
  uint in_ESI;
  long in_RDI;
  ScopedTimer __var292;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int local_e0;
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [39];
  allocator local_49;
  string local_48 [60];
  uint local_c;
  
  local_c = in_ESI;
  if (DoClose(int)::__var92 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoClose(int)::__var92);
    if (iVar1 != 0) {
      uVar3 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/ssc/SscReader.cpp"
                                  ,
                                  "virtual void adios2::core::engine::SscReader::DoClose(const int)"
                                  ,0x5c);
      DoClose::__var92 = (void *)ps_timer_create_(uVar3);
      __cxa_guard_release(&DoClose(int)::__var92);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (void *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Engine",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"SscReader",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"Close",&local_99);
  if (*(int *)(in_RDI + 0xc0) < 10) {
    local_e0 = 0;
  }
  else {
    local_e0 = adios2::helper::Comm::Rank();
  }
  iVar2 = adios2::helper::Comm::Rank();
  iVar1 = *(int *)(in_RDI + 0xc0);
  adios2::helper::Log(local_48,local_70,local_98,(string *)(in_RDI + 0x30),local_e0,iVar2,5,iVar1,
                      INFO);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  peVar4 = std::
           __shared_ptr_access<adios2::core::engine::ssc::SscReaderBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<adios2::core::engine::ssc::SscReaderBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d88a8);
  (*peVar4->_vptr_SscReaderBase[6])(peVar4,(ulong)local_c);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_ffffffffffffff04,iVar1));
  return;
}

Assistant:

void SscReader::DoClose(const int transportIndex)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();

    helper::Log("Engine", "SscReader", "Close", m_Name, m_Verbosity >= 10 ? m_Comm.Rank() : 0,
                m_Comm.Rank(), 5, m_Verbosity, helper::LogMode::INFO);

    m_EngineInstance->Close(transportIndex);
}